

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  int r;
  uint64_t mode;
  uint64_t size;
  uv_fs_t stat_req;
  uv_fs_t *req_local;
  
  stat_req.bufsml[3].len = (size_t)req;
  if (req->fs_type != UV_FS_COPYFILE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x33,"req->fs_type == UV_FS_COPYFILE");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x34,"req->result == 0");
    abort();
  }
  iVar3 = uv_fs_stat(0,&size,req->path);
  uVar2 = stat_req.statbuf.st_ino;
  uVar1 = stat_req.statbuf.st_dev;
  if (iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x38,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&size);
  iVar3 = uv_fs_stat(0,&size,"test_file_dst");
  if (iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x3d,"r == 0");
    abort();
  }
  if (stat_req.statbuf.st_ino != uVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x3e,"stat_req.statbuf.st_size == size");
    abort();
  }
  if (stat_req.statbuf.st_dev != uVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
            ,0x3f,"stat_req.statbuf.st_mode == mode");
    abort();
  }
  uv_fs_req_cleanup(&size);
  uv_fs_req_cleanup(stat_req.bufsml[3].len);
  result_check_count = result_check_count + 1;
  return;
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT(req->fs_type == UV_FS_COPYFILE);
  ASSERT(req->result == 0);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_size == size);
  ASSERT(stat_req.statbuf.st_mode == mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}